

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O1

void leveldb::_Test_TestCloseOnExecWritableFile::_RunIt(void)

{
  _Test_TestCloseOnExecWritableFile t;
  _Test_TestCloseOnExecWritableFile local_8;
  
  local_8.super_EnvPosixTest.env_ = (EnvPosixTest)Env::Default();
  _Run(&local_8);
  return;
}

Assistant:

TEST(EnvPosixTest, TestCloseOnExecWritableFile) {
  std::unordered_set<int> open_fds;
  GetOpenFileDescriptors(&open_fds);

  std::string test_dir;
  ASSERT_OK(env_->GetTestDirectory(&test_dir));
  std::string file_path = test_dir + "/close_on_exec_writable.txt";
  ASSERT_OK(WriteStringToFile(env_, "0123456789", file_path));

  leveldb::WritableFile* file = nullptr;
  ASSERT_OK(env_->NewWritableFile(file_path, &file));
  CheckCloseOnExecDoesNotLeakFDs(open_fds);
  delete file;

  ASSERT_OK(env_->DeleteFile(file_path));
}